

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_getmyuid(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iValue;
  void *pvVar1;
  char *pcVar2;
  int nUid;
  jx9_vfs *pVfs;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pvVar1 = jx9_context_user_data(pCtx);
  if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x138) == 0)) {
    pcVar2 = jx9_function_name(pCtx);
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",pcVar2);
    jx9_result_int(pCtx,-1);
  }
  else {
    iValue = (**(code **)((long)pvVar1 + 0x138))();
    jx9_result_int(pCtx,iValue);
  }
  return 0;
}

Assistant:

static int jx9Vfs_getmyuid(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vfs *pVfs;
	int nUid;
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xUid == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* IO routine not implemented, return -1 */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Perform the requested operation */
	nUid = pVfs->xUid();
	/* Set the result */
	jx9_result_int(pCtx, nUid);
	return JX9_OK;
}